

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall
QAbstractItemViewPrivate::doDelayedItemsLayout(QAbstractItemViewPrivate *this,int delay)

{
  undefined4 in_ESI;
  QAbstractItemViewPrivate *in_RDI;
  int in_stack_0000000c;
  undefined4 in_stack_fffffffffffffff0;
  
  if ((in_RDI->delayedPendingLayout & 1U) == 0) {
    in_RDI->delayedPendingLayout = true;
    q_func(in_RDI);
    QBasicTimer::start((QBasicTimer *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_0000000c,
                       (QObject *)in_RDI);
  }
  return;
}

Assistant:

void QAbstractItemViewPrivate::doDelayedItemsLayout(int delay)
{
    if (!delayedPendingLayout) {
        delayedPendingLayout = true;
        delayedLayout.start(delay, q_func());
    }
}